

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void Elimination(Grammer *g)

{
  char cVar1;
  undefined1 uVar2;
  long lVar3;
  _Rb_tree_color _Var4;
  undefined8 *puVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  long *plVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  size_type *psVar12;
  long lVar13;
  ulong uVar14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  _Self __tmp_2;
  long lVar17;
  char replace;
  string t1;
  string tmp_1;
  _Self __tmp_1;
  string tmp;
  string sub_string2;
  string sub_string1;
  string result;
  string sub_string3;
  _Self __tmp;
  char local_201;
  long *local_200;
  ulong local_1f8;
  long local_1f0;
  undefined8 uStack_1e8;
  string local_1e0;
  _Rb_tree_node_base *local_1c0;
  _Base_ptr local_1b8;
  _Base_ptr local_1b0;
  Grammer *local_1a8;
  string local_1a0;
  undefined1 *local_180;
  ulong local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  long *local_160;
  ulong local_158;
  long local_150 [2];
  undefined1 *local_140;
  long local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined1 *local_120;
  long local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  string local_e0;
  string local_c0;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  string local_80;
  string local_60;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_180 = &local_170;
  local_178 = 0;
  local_170 = 0;
  local_120 = &local_110;
  local_118 = 0;
  local_110 = 0;
  local_140 = &local_130;
  local_138 = 0;
  local_130 = 0;
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  local_100 = &local_f0;
  local_f8 = 0;
  local_f0 = 0;
  p_Var7 = (g->Vt)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(g->Vt)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a8 = g;
  if (p_Var7 != local_40) {
    local_1c0 = (_Rb_tree_node_base *)&g->grammer_map;
    local_1b8 = &(g->grammer_map)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_1b0 = p_Var7 + 1;
      local_38 = p_Var7;
      std::
      map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1c0,(key_type *)local_1b0);
      std::__cxx11::string::_M_assign((string *)&local_180);
      if (local_178 != 0) {
        lVar17 = -1;
        uVar14 = 0;
        uVar8 = local_178;
        do {
          p_Var7 = (g->grammer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var7 != (_Base_ptr)0x0) {
            cVar1 = local_180[uVar14];
            p_Var16 = local_1b8;
            do {
              uVar2 = (undefined1)p_Var7[1]._M_color;
              if (cVar1 <= (char)uVar2) {
                p_Var16 = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[(char)uVar2 < cVar1];
            } while (p_Var7 != (_Base_ptr)0x0);
            if ((p_Var16 != local_1b8) && ((char)p_Var16[1]._M_color <= cVar1)) {
              lVar13 = lVar17;
              do {
                lVar3 = lVar13 + 1;
                lVar13 = lVar13 + 1;
              } while (local_180[lVar3] != '|');
              std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_180);
              std::__cxx11::string::operator=((string *)&local_120,(string *)&local_200);
              if (local_200 != &local_1f0) {
                operator_delete(local_200,local_1f0 + 1);
              }
              std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_180);
              std::__cxx11::string::operator=((string *)&local_140,(string *)&local_200);
              g = local_1a8;
              if (local_200 != &local_1f0) {
                operator_delete(local_200,local_1f0 + 1);
              }
              std::
              map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1c0,local_180 + uVar14);
              std::__cxx11::string::_M_assign((string *)&local_a0);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,local_a0,local_a0 + local_98);
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,local_140,local_140 + local_138);
              substitution(&local_1e0,&local_c0,&local_60);
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_120);
              plVar9 = puVar5 + 2;
              if ((long *)*puVar5 == plVar9) {
                local_1f0 = *plVar9;
                uStack_1e8 = puVar5[3];
                local_200 = &local_1f0;
              }
              else {
                local_1f0 = *plVar9;
                local_200 = (long *)*puVar5;
              }
              local_1f8 = puVar5[1];
              *puVar5 = plVar9;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_100,(string *)&local_200);
              if (local_200 != &local_1f0) {
                operator_delete(local_200,local_1f0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                         local_1e0.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_1c0,(key_type *)local_1b0);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              uVar8 = local_178;
            }
          }
          uVar14 = uVar14 + 1;
          lVar17 = lVar17 + 1;
        } while (uVar14 < uVar8);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_38);
    } while (p_Var7 != local_40);
  }
  p_Var10 = (g->grammer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(g->grammer_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var10 != p_Var15) {
    local_1b0 = (_Base_ptr)&g->grammer_map;
    local_1c0 = p_Var15;
    do {
      local_200 = &local_1f0;
      local_1b8 = p_Var10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,p_Var10[1]._M_parent,
                 (long)&(p_Var10[1]._M_parent)->_M_color + (long)&(p_Var10[1]._M_left)->_M_color);
      if (local_1f8 != 0) {
        p_Var15 = local_1b8 + 1;
        uVar14 = 0;
        uVar8 = local_1f8;
        do {
          if (*(char *)((long)local_200 + uVar14) == '|') {
            std::__cxx11::string::substr((ulong)&local_1e0,(ulong)&local_200);
            lVar17 = *local_200;
            _Var4 = p_Var15->_M_color;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                       local_1e0.field_2._M_local_buf[0]) + 1);
            }
            uVar8 = local_1f8;
            g = local_1a8;
            if ((char)lVar17 == (char)_Var4) {
              local_201 = (char)p_Var15->_M_color + _S_black;
              std::__cxx11::string::substr((ulong)&local_1e0,(ulong)&local_200);
              g = local_1a8;
              std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                         local_1e0.field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::string::substr((ulong)&local_1e0,(ulong)&local_200);
              std::__cxx11::string::operator=((string *)&local_140,(string *)&local_1e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                         local_1e0.field_2._M_local_buf[0]) + 1);
              }
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              local_1e0._M_string_length = 0;
              local_1e0.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::push_back((char)&local_1e0);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,local_120,local_120 + local_118);
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_80,local_1e0._M_dataplus._M_p,
                         local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
              substitution(&local_1a0,&local_e0,&local_80);
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_1b0,(key_type *)p_Var15);
              std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              local_160 = local_150;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_160,local_140,local_140 + local_138);
              std::__cxx11::string::_M_replace_aux((ulong)&local_160,local_158,0,'\x01');
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_160);
              psVar12 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_1a0.field_2._M_allocated_capacity = *psVar12;
                local_1a0.field_2._8_8_ = plVar9[3];
                local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              }
              else {
                local_1a0.field_2._M_allocated_capacity = *psVar12;
                local_1a0._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_1a0._M_string_length = plVar9[1];
              *plVar9 = (long)psVar12;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_100,(string *)&local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p,
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if (local_160 != local_150) {
                operator_delete(local_160,local_150[0] + 1);
              }
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_1b0,&local_201);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                         local_1e0.field_2._M_local_buf[0]) + 1);
              }
              break;
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar8);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1b8);
    } while (p_Var10 != local_1c0);
    p_Var10 = (g->grammer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var15 = local_1c0;
  }
  if (p_Var10 != p_Var15) {
    do {
      local_200 = (long *)CONCAT71(local_200._1_7_,(char)p_Var10[1]._M_color);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)&local_200,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"->",2);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)p_Var10[1]._M_parent,(long)p_Var10[1]._M_left);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != p_Var15);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  return;
}

Assistant:

void Elimination(Grammer g)
{
    //代入
    set<char>::iterator it1, it2;
    string tmp,sub_string1,sub_string2, sub_string3,result;
    for (it1 = g.Vt.begin(); it1 != g.Vt.end(); it1++)
    {
        tmp = g.grammer_map[*it1];
        for (int i = 0; i < tmp.length(); i++)
        {
            if (g.grammer_map.find(tmp[i]) != g.grammer_map.end())//有没有相应的非终结符
            {
                int t=i;//用来定位|的位置
                while (tmp[t] != '|')
                    t++;
                sub_string1 = tmp.substr(t, tmp.length() - t);
                sub_string2 = tmp.substr(i+1,t-i-1);
                sub_string3 = g.grammer_map[tmp[i]];
                result = substitution(sub_string3, sub_string2) + sub_string1;
                g.grammer_map[*it1] = result;
            }
        }
    }
    //消除左递归
    map<char, string>::iterator it;
    for (it = g.grammer_map.begin(); it != g.grammer_map.end(); it++)
    {
        int flag = false;//是否出现左递归的标志
        int t = 0;
        string t1 = (*it).second;
        //t是非终结符的位置，i是‘|’的位置
        int i;
        for (i = 0; i < t1.length(); i++)
        {
            if (t1[i] == '|')
            {
                string tmp = t1.substr(t, i - t);
                if (t1[0] == (*it).first)//出现了左递归
                {
                    flag = true;
                    break;
                }
                t = i + 1;
            }
        }
        if (flag)
        {
            char replace;
            while (1)
            {
                int j = 1;
                if (g.grammer_map.find((*it).first + j) == g.grammer_map.end())
                {
                    replace = (*it).first + j;
                    break;
                }
                j++;
            }
            //t是非终结符的位置，i是‘|’的位置
            sub_string1 = t1.substr(i + 1, t1.length() - i);//后半部分
            sub_string2 = t1.substr(t + 1, i - t - 1);
            string tmp2;
            tmp2.push_back(replace);
            g.grammer_map[(*it).first] = substitution(sub_string1, tmp2);
            result = sub_string2 + replace + "|@";
            g.grammer_map[replace] = result;
        }
    }
    //map<char, string>::iterator it;
    for (it = g.grammer_map.begin(); it != g.grammer_map.end(); it++)
    {
        cout << (*it).first << "->" << (*it).second << endl;
    }
}